

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool __thiscall Divide<0,_1,_1>::propagate(Divide<0,_1,_1> *this)

{
  int iVar1;
  int iVar2;
  IntVar *pIVar3;
  IntVar *pIVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  pIVar3 = (this->x).var;
  pIVar4 = (this->y).var;
  lVar12 = (long)(pIVar3->min).v;
  lVar11 = (long)(pIVar3->max).v;
  iVar7 = (pIVar4->max).v;
  uVar8 = (ulong)(pIVar4->min).v;
  lVar14 = -uVar8;
  pIVar4 = (this->z).var;
  iVar1 = (pIVar4->max).v;
  lVar13 = -(long)iVar1;
  iVar2 = (pIVar4->min).v;
  lVar9 = (long)(~uVar8 + lVar12) / lVar14;
  if (lVar9 != lVar13 && SBORROW8(lVar9,lVar13) == lVar9 + iVar1 < 0) {
    if (so.lazy) {
      iVar5 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[8])();
      uVar6 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar8 = (ulong)uVar6 << 0x20 | (long)iVar5 << 2 | 3;
    }
    else {
      uVar8 = 0;
    }
    pIVar3 = (this->z).var;
    iVar5 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xf])(pIVar3,-lVar9,uVar8,1);
    if ((char)iVar5 == '\0') {
      return false;
    }
  }
  lVar15 = -(long)iVar7;
  lVar9 = (lVar15 + lVar11 + -1) / lVar15;
  lVar10 = (long)(((this->z).var)->min).v;
  if (SBORROW8(lVar9,-lVar10) != lVar9 + lVar10 < 0) {
    if (so.lazy == true) {
      iVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar6 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar8 = (ulong)uVar6 << 0x20 | (long)iVar7 << 2 | 3;
    }
    else {
      uVar8 = 0;
    }
    pIVar3 = (this->z).var;
    iVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xe])(pIVar3,-lVar9,uVar8,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
  }
  lVar15 = lVar15 * (lVar13 + -1);
  if ((((this->x).var)->min).v <= lVar15) {
    if (so.lazy == true) {
      iVar7 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar6 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar8 = (ulong)uVar6 << 0x20 | (long)iVar7 << 2 | 3;
    }
    else {
      uVar8 = 0;
    }
    pIVar3 = (this->x).var;
    iVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xe])(pIVar3,lVar15 + 1,uVar8,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
  }
  lVar9 = -(long)iVar2;
  lVar14 = lVar14 * lVar9;
  if (lVar14 < (((this->x).var)->max).v) {
    if (so.lazy == true) {
      iVar7 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar6 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar8 = (ulong)uVar6 << 0x20 | (long)iVar7 << 2 | 3;
    }
    else {
      uVar8 = 0;
    }
    pIVar3 = (this->x).var;
    iVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xf])(pIVar3,lVar14,uVar8,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
  }
  if ((iVar2 < 0) &&
     (lVar9 = (lVar12 + lVar9 + -1) / lVar9, lVar12 = (long)(((this->y).var)->max).v,
     lVar14 = -lVar12, lVar9 != lVar14 && SBORROW8(lVar9,lVar14) == lVar9 + lVar12 < 0)) {
    if (so.lazy == true) {
      iVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar6 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar8 = (ulong)uVar6 << 0x20 | (long)iVar7 << 2 | 3;
    }
    else {
      uVar8 = 0;
    }
    pIVar3 = (this->y).var;
    iVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xf])(pIVar3,-lVar9,uVar8,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
  }
  if (-2 < iVar1) {
    return true;
  }
  lVar9 = (lVar11 + lVar13 + -2) / (lVar13 + -1);
  lVar11 = (long)(((this->y).var)->min).v;
  lVar12 = -lVar11;
  if (lVar9 == lVar12 || SBORROW8(lVar9,lVar12) != lVar9 + lVar11 < 0) {
    if (so.lazy == true) {
      iVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar6 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar8 = (ulong)uVar6 << 0x20 | (long)iVar7 << 2 | 3;
    }
    else {
      uVar8 = 0;
    }
    pIVar3 = (this->y).var;
    iVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xe])(pIVar3,1 - lVar9,uVar8,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate() override {
		const int64_t x_min = x.getMin();
		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();
		const int64_t y_max = y.getMax();
		const int64_t z_min = z.getMin();
		const int64_t z_max = z.getMax();

		// z >= ceil(x.min / y.max)
		setDom(z, setMin, (x_min + y_max - 1) / y_max, x.getMinLit(), y.getMaxLit());
		// z <= ceil(x.max / y.min)
		setDom(z, setMax, (x_max + y_min - 1) / y_min, x.getMaxLit(), y.getMinLit());

		// x >= y.min * (z.min - 1) + 1
		setDom(x, setMin, y_min * (z_min - 1) + 1, y.getMinLit(), z.getMinLit());
		// x <= y.max * z.max
		setDom(x, setMax, y_max * z_max, y.getMaxLit(), z.getMaxLit());

		// y >= ceil(x.min / z.max)
		if (z_max >= 1) {
			setDom(y, setMin, (x_min + z_max - 1) / z_max, x.getMinLit(), z.getMaxLit());
		}

		// y <= ceil(x.max / z.min-1) - 1
		if (z_min >= 2) {
			setDom(y, setMax, (x_max + z_min - 2) / (z_min - 1) - 1, x.getMaxLit(), z.getMinLit());
		}

		return true;
	}